

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

size_t al_fwrite16le(ALLEGRO_FILE *f,int16_t w)

{
  size_t sVar1;
  size_t sVar2;
  uint8_t b;
  uint8_t b_1;
  char local_1a;
  byte local_19;
  
  f->ungetc_len = 0;
  local_1a = (char)w;
  sVar1 = (*f->vtable->fi_fwrite)(f,&local_1a,1);
  sVar2 = 0;
  if ((sVar1 == 1) && (local_1a == (char)w)) {
    local_19 = (byte)((ushort)w >> 8);
    f->ungetc_len = 0;
    sVar1 = (*f->vtable->fi_fwrite)(f,&local_19,1);
    sVar2 = (ulong)((ushort)w >> 8 == (ushort)local_19 && sVar1 == 1) + 1;
  }
  return sVar2;
}

Assistant:

size_t al_fwrite16le(ALLEGRO_FILE *f, int16_t w)
{
   uint8_t b1, b2;
   ASSERT(f);

   b1 = (w & 0xFF00) >> 8;
   b2 = w & 0x00FF;

   if (al_fputc(f, b2) == b2) {
      if (al_fputc(f, b1) == b1) {
         return 2;
      }
      return 1;
   }
   return 0;
}